

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cpp
# Opt level: O1

void __thiscall sqlite::Connection::Stmt::Stmt(Stmt *this,string *sql,Connection *db)

{
  int sqlite_error_code;
  sqlite3 *psVar1;
  Logic_error *this_00;
  long *plVar2;
  size_type *psVar3;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  this->stmt_ = (sqlite3_stmt *)0x0;
  psVar1 = Connection::get_c_obj(db);
  this->db_ = psVar1;
  psVar1 = Connection::get_c_obj(db);
  sqlite_error_code =
       sqlite3_prepare_v2(psVar1,(sql->_M_dataplus)._M_p,(int)sql->_M_string_length + 1,this,0);
  if (sqlite_error_code == 0) {
    return;
  }
  this_00 = (Logic_error *)__cxa_allocate_exception(0x48);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"Error parsing SQL: ","");
  psVar1 = Connection::get_c_obj(db);
  sqlite3_errmsg(psVar1);
  plVar2 = (long *)std::__cxx11::string::append((char *)local_50);
  local_70._M_dataplus._M_p = (pointer)*plVar2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_70._M_dataplus._M_p == psVar3) {
    local_70.field_2._M_allocated_capacity = *psVar3;
    local_70.field_2._8_8_ = plVar2[3];
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  }
  else {
    local_70.field_2._M_allocated_capacity = *psVar3;
  }
  local_70._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  Logic_error::Logic_error(this_00,&local_70,sql,sqlite_error_code,this->db_);
  __cxa_throw(this_00,&Logic_error::typeinfo,Logic_error::~Logic_error);
}

Assistant:

Connection::Stmt::Stmt(const std::string & sql, Connection & db):
        db_(db.get_c_obj())
    {
        int status = sqlite3_prepare_v2(db.get_c_obj(), sql.c_str(), sql.length() + 1, &stmt_, NULL);

        if(status != SQLITE_OK)
        {
            throw Logic_error("Error parsing SQL: "s + sqlite3_errmsg(db.get_c_obj()), sql, status, db_);
        }
    }